

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmGeneratorTarget.cxx
# Opt level: O1

void __thiscall
cmGeneratorTarget::ComputeLinkImplementationRuntimeLibraries
          (cmGeneratorTarget *this,string *config,cmOptionalLinkImplementation *impl)

{
  cmMakefile *this_00;
  pointer pbVar1;
  int iVar2;
  iterator iVar3;
  long *plVar4;
  cmValue cVar5;
  mapped_type *pmVar6;
  size_type *psVar7;
  cmGeneratorTarget *pcVar8;
  _Base_ptr __k;
  pointer name;
  string_view arg;
  vector<cmLinkImplItem,_std::allocator<cmLinkImplItem>_> implicitTargets;
  TargetOrString resolved;
  cmListFileBacktrace bt;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  libsVec;
  vector<cmLinkImplItem,_std::allocator<cmLinkImplItem>_> local_178;
  _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<cmLinkImplItem,_std::allocator<cmLinkImplItem>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<cmLinkImplItem,_std::allocator<cmLinkImplItem>_>_>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
  *local_160;
  undefined1 local_158 [72];
  TargetOrString local_110;
  cmConstStack<cmListFileContext,_cmListFileBacktrace> local_e8;
  undefined1 local_d8 [16];
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_c8;
  string local_b0;
  cmLinkItem local_90;
  cmGeneratorTarget *local_50;
  _Base_ptr local_48;
  _Base_ptr local_40;
  cmLocalGenerator *local_38;
  
  __k = (_Base_ptr)
        (impl->super_cmLinkImplementation).Languages.
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_start;
  local_40 = (_Base_ptr)
             (impl->super_cmLinkImplementation).Languages.
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ._M_impl.super__Vector_impl_data._M_finish;
  if (__k != local_40) {
    local_160 = &(impl->super_cmLinkImplementation).LanguageRuntimeLibraries._M_h;
    local_50 = this;
    local_48 = (_Base_ptr)config;
    do {
      iVar2 = std::__cxx11::string::compare((char *)__k);
      if (iVar2 == 0) {
LAB_0036986d:
        iVar3 = std::
                _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<cmLinkImplItem,_std::allocator<cmLinkImplItem>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<cmLinkImplItem,_std::allocator<cmLinkImplItem>_>_>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
                ::find(local_160,(key_type *)__k);
        if (iVar3.
            super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<cmLinkImplItem,_std::allocator<cmLinkImplItem>_>_>,_true>
            ._M_cur == (__node_type *)0x0) {
          cmConstStack<cmListFileContext,_cmListFileBacktrace>::cmConstStack(&local_e8);
          pcVar8 = local_50;
          local_178.super__Vector_base<cmLinkImplItem,_std::allocator<cmLinkImplItem>_>._M_impl.
          super__Vector_impl_data._M_start = (pointer)0x0;
          local_178.super__Vector_base<cmLinkImplItem,_std::allocator<cmLinkImplItem>_>._M_impl.
          super__Vector_impl_data._M_finish = (pointer)0x0;
          local_178.super__Vector_base<cmLinkImplItem,_std::allocator<cmLinkImplItem>_>._M_impl.
          super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
          local_38 = local_50->LocalGenerator;
          GetRuntimeLinkLibrary(&local_b0,local_50,(string *)__k,(string *)local_48);
          this_00 = pcVar8->Makefile;
          std::operator+(&local_110.String,"CMAKE_",
                         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)__k);
          plVar4 = (long *)std::__cxx11::string::append((char *)&local_110);
          local_90.String._M_dataplus._M_p = (pointer)&local_90.String.field_2;
          psVar7 = (size_type *)(plVar4 + 2);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)*plVar4 ==
              (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)psVar7) {
            local_90.String.field_2._M_allocated_capacity = *psVar7;
            local_90.String.field_2._8_8_ = plVar4[3];
          }
          else {
            local_90.String.field_2._M_allocated_capacity = *psVar7;
            local_90.String._M_dataplus._M_p = (pointer)*plVar4;
          }
          local_90.String._M_string_length = plVar4[1];
          *plVar4 = (long)psVar7;
          plVar4[1] = 0;
          *(undefined1 *)(plVar4 + 2) = 0;
          plVar4 = (long *)std::__cxx11::string::_M_append
                                     ((char *)&local_90,(ulong)local_b0._M_dataplus._M_p);
          local_158._0_8_ = local_158 + 0x10;
          psVar7 = (size_type *)(plVar4 + 2);
          if ((size_type *)*plVar4 == psVar7) {
            local_158._16_8_ = *psVar7;
            local_158._24_8_ = plVar4[3];
          }
          else {
            local_158._16_8_ = *psVar7;
            local_158._0_8_ = (size_type *)*plVar4;
          }
          local_158._8_8_ = plVar4[1];
          *plVar4 = (long)psVar7;
          plVar4[1] = 0;
          *(undefined1 *)(plVar4 + 2) = 0;
          cVar5 = cmMakefile::GetDefinition(this_00,(string *)local_158);
          if ((undefined1 *)local_158._0_8_ != local_158 + 0x10) {
            operator_delete((void *)local_158._0_8_,local_158._16_8_ + 1);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_90.String._M_dataplus._M_p != &local_90.String.field_2) {
            operator_delete(local_90.String._M_dataplus._M_p,
                            local_90.String.field_2._M_allocated_capacity + 1);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_110.String._M_dataplus._M_p != &local_110.String.field_2) {
            operator_delete(local_110.String._M_dataplus._M_p,
                            local_110.String.field_2._M_allocated_capacity + 1);
          }
          if (cVar5.Value != (string *)0x0) {
            arg._M_str = ((cVar5.Value)->_M_dataplus)._M_p;
            arg._M_len = (cVar5.Value)->_M_string_length;
            cmExpandedList_abi_cxx11_(&local_c8,arg,false);
            pcVar8 = (cmGeneratorTarget *)
                     ((long)local_c8.
                            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                            ._M_impl.super__Vector_impl_data._M_finish -
                      (long)local_c8.
                            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                            ._M_impl.super__Vector_impl_data._M_start >> 5);
            std::vector<cmLinkImplItem,_std::allocator<cmLinkImplItem>_>::reserve
                      (&local_178,(size_type)pcVar8);
            pbVar1 = local_c8.
                     super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_finish;
            for (name = local_c8.
                        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        ._M_impl.super__Vector_impl_data._M_start; name != pbVar1; name = name + 1)
            {
              ResolveTargetReference(&local_110,pcVar8,name,local_38);
              pcVar8 = local_110.Target;
              if (local_110.Target != (cmGeneratorTarget *)0x0) {
                local_d8._0_8_ =
                     local_e8.TopEntry.
                     super___shared_ptr<const_cmConstStack<cmListFileContext,_cmListFileBacktrace>::Entry,_(__gnu_cxx::_Lock_policy)2>
                     ._M_ptr;
                local_d8._8_8_ =
                     local_e8.TopEntry.
                     super___shared_ptr<const_cmConstStack<cmListFileContext,_cmListFileBacktrace>::Entry,_(__gnu_cxx::_Lock_policy)2>
                     ._M_refcount._M_pi;
                if (local_e8.TopEntry.
                    super___shared_ptr<const_cmConstStack<cmListFileContext,_cmListFileBacktrace>::Entry,_(__gnu_cxx::_Lock_policy)2>
                    ._M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
                  if (__libc_single_threaded == '\0') {
                    LOCK();
                    *(_Atomic_word *)
                     ((long)local_e8.TopEntry.
                            super___shared_ptr<const_cmConstStack<cmListFileContext,_cmListFileBacktrace>::Entry,_(__gnu_cxx::_Lock_policy)2>
                            ._M_refcount._M_pi + 8) =
                         *(_Atomic_word *)
                          ((long)local_e8.TopEntry.
                                 super___shared_ptr<const_cmConstStack<cmListFileContext,_cmListFileBacktrace>::Entry,_(__gnu_cxx::_Lock_policy)2>
                                 ._M_refcount._M_pi + 8) + 1;
                    UNLOCK();
                  }
                  else {
                    *(_Atomic_word *)
                     ((long)local_e8.TopEntry.
                            super___shared_ptr<const_cmConstStack<cmListFileContext,_cmListFileBacktrace>::Entry,_(__gnu_cxx::_Lock_policy)2>
                            ._M_refcount._M_pi + 8) =
                         *(_Atomic_word *)
                          ((long)local_e8.TopEntry.
                                 super___shared_ptr<const_cmConstStack<cmListFileContext,_cmListFileBacktrace>::Entry,_(__gnu_cxx::_Lock_policy)2>
                                 ._M_refcount._M_pi + 8) + 1;
                  }
                }
                cmLinkItem::cmLinkItem
                          (&local_90,local_110.Target,false,(cmListFileBacktrace *)local_d8);
                cmLinkImplItem::cmLinkImplItem((cmLinkImplItem *)local_158,&local_90,false);
                if (local_90.Backtrace.super_cmConstStack<cmListFileContext,_cmListFileBacktrace>.
                    TopEntry.
                    super___shared_ptr<const_cmConstStack<cmListFileContext,_cmListFileBacktrace>::Entry,_(__gnu_cxx::_Lock_policy)2>
                    ._M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
                  std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                            (local_90.Backtrace.
                             super_cmConstStack<cmListFileContext,_cmListFileBacktrace>.TopEntry.
                             super___shared_ptr<const_cmConstStack<cmListFileContext,_cmListFileBacktrace>::Entry,_(__gnu_cxx::_Lock_policy)2>
                             ._M_refcount._M_pi);
                }
                if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)local_90.String._M_dataplus._M_p != &local_90.String.field_2) {
                  operator_delete(local_90.String._M_dataplus._M_p,
                                  local_90.String.field_2._M_allocated_capacity + 1);
                }
                if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_d8._8_8_ !=
                    (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
                  std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                            ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_d8._8_8_);
                }
                pcVar8 = (cmGeneratorTarget *)local_158;
                std::vector<cmLinkImplItem,_std::allocator<cmLinkImplItem>_>::
                emplace_back<cmLinkImplItem>(&local_178,(cmLinkImplItem *)pcVar8);
                if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_158._56_8_ !=
                    (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
                  std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                            ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_158._56_8_);
                }
                if ((undefined1 *)local_158._0_8_ != local_158 + 0x10) {
                  pcVar8 = (cmGeneratorTarget *)(local_158._16_8_ + 1);
                  operator_delete((void *)local_158._0_8_,(ulong)pcVar8);
                }
              }
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_110.String._M_dataplus._M_p != &local_110.String.field_2) {
                pcVar8 = (cmGeneratorTarget *)(local_110.String.field_2._M_allocated_capacity + 1);
                operator_delete(local_110.String._M_dataplus._M_p,(ulong)pcVar8);
              }
            }
            std::
            vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ::~vector(&local_c8);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_b0._M_dataplus._M_p != &local_b0.field_2) {
            operator_delete(local_b0._M_dataplus._M_p,local_b0.field_2._M_allocated_capacity + 1);
          }
          if (local_e8.TopEntry.
              super___shared_ptr<const_cmConstStack<cmListFileContext,_cmListFileBacktrace>::Entry,_(__gnu_cxx::_Lock_policy)2>
              ._M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
            std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                      (local_e8.TopEntry.
                       super___shared_ptr<const_cmConstStack<cmListFileContext,_cmListFileBacktrace>::Entry,_(__gnu_cxx::_Lock_policy)2>
                       ._M_refcount._M_pi);
          }
          pmVar6 = std::__detail::
                   _Map_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<cmLinkImplItem,_std::allocator<cmLinkImplItem>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<cmLinkImplItem,_std::allocator<cmLinkImplItem>_>_>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                   ::operator[]((_Map_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<cmLinkImplItem,_std::allocator<cmLinkImplItem>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<cmLinkImplItem,_std::allocator<cmLinkImplItem>_>_>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                                 *)local_160,(key_type *)__k);
          local_158._0_8_ =
               (pmVar6->super__Vector_base<cmLinkImplItem,_std::allocator<cmLinkImplItem>_>)._M_impl
               .super__Vector_impl_data._M_start;
          local_158._8_8_ =
               (pmVar6->super__Vector_base<cmLinkImplItem,_std::allocator<cmLinkImplItem>_>)._M_impl
               .super__Vector_impl_data._M_finish;
          local_158._16_8_ =
               (pmVar6->super__Vector_base<cmLinkImplItem,_std::allocator<cmLinkImplItem>_>)._M_impl
               .super__Vector_impl_data._M_end_of_storage;
          (pmVar6->super__Vector_base<cmLinkImplItem,_std::allocator<cmLinkImplItem>_>)._M_impl.
          super__Vector_impl_data._M_start =
               local_178.super__Vector_base<cmLinkImplItem,_std::allocator<cmLinkImplItem>_>._M_impl
               .super__Vector_impl_data._M_start;
          (pmVar6->super__Vector_base<cmLinkImplItem,_std::allocator<cmLinkImplItem>_>)._M_impl.
          super__Vector_impl_data._M_finish =
               local_178.super__Vector_base<cmLinkImplItem,_std::allocator<cmLinkImplItem>_>._M_impl
               .super__Vector_impl_data._M_finish;
          (pmVar6->super__Vector_base<cmLinkImplItem,_std::allocator<cmLinkImplItem>_>)._M_impl.
          super__Vector_impl_data._M_end_of_storage =
               local_178.super__Vector_base<cmLinkImplItem,_std::allocator<cmLinkImplItem>_>._M_impl
               .super__Vector_impl_data._M_end_of_storage;
          local_178.super__Vector_base<cmLinkImplItem,_std::allocator<cmLinkImplItem>_>._M_impl.
          super__Vector_impl_data._M_start = (pointer)0x0;
          local_178.super__Vector_base<cmLinkImplItem,_std::allocator<cmLinkImplItem>_>._M_impl.
          super__Vector_impl_data._M_finish = (pointer)0x0;
          local_178.super__Vector_base<cmLinkImplItem,_std::allocator<cmLinkImplItem>_>._M_impl.
          super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
          std::vector<cmLinkImplItem,_std::allocator<cmLinkImplItem>_>::~vector
                    ((vector<cmLinkImplItem,_std::allocator<cmLinkImplItem>_> *)local_158);
          std::vector<cmLinkImplItem,_std::allocator<cmLinkImplItem>_>::~vector(&local_178);
        }
      }
      else {
        iVar2 = std::__cxx11::string::compare((char *)__k);
        if (iVar2 == 0) goto LAB_0036986d;
      }
      __k = __k + 1;
    } while (__k != local_40);
  }
  return;
}

Assistant:

void cmGeneratorTarget::ComputeLinkImplementationRuntimeLibraries(
  const std::string& config, cmOptionalLinkImplementation& impl) const
{
  for (std::string const& lang : impl.Languages) {
    if ((lang == "CUDA" || lang == "HIP") &&
        impl.LanguageRuntimeLibraries.find(lang) ==
          impl.LanguageRuntimeLibraries.end()) {
      auto implicitTargets =
        computeImplicitLanguageTargets<cmLinkImplItem>(lang, config, this);
      impl.LanguageRuntimeLibraries[lang] = std::move(implicitTargets);
    }
  }
}